

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

my_rational my_rational_construct(uint numerator,uint denominator)

{
  my_rational mVar1;
  uint uVar2;
  uint g;
  uint denominator_local;
  uint numerator_local;
  my_rational result;
  
  if (denominator != 0) {
    if (numerator == 0) {
      denominator_local = 0;
      numerator_local = 1;
    }
    else {
      uVar2 = gcd(numerator,denominator);
      denominator_local = numerator / uVar2;
      numerator_local = denominator / uVar2;
    }
    mVar1.d = numerator_local;
    mVar1.n = denominator_local;
    return mVar1;
  }
  __assert_fail("denominator > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c",
                0x6a3,"struct my_rational my_rational_construct(unsigned int, unsigned int)");
}

Assistant:

struct my_rational my_rational_construct(unsigned int numerator,
		unsigned int denominator)
{
	struct my_rational result;

	assert(denominator > 0);
	if (numerator == 0) {
		/* Use 0 / 1 as the way to represent zero. */
		result.n = 0;
		result.d = 1;
	} else {
		unsigned int g = gcd(numerator, denominator);

		result.n = numerator / g;
		result.d = denominator / g;
	}
	return result;
}